

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O2

IterateResult __thiscall deqp::gls::RandomShaderCase::iterate(RandomShaderCase *this)

{
  IVec3 *pIVar1;
  Type TVar2;
  TextureFormat log;
  RenderContext *pRVar3;
  ShaderInput *pSVar4;
  MessageBuilder *message;
  pointer pSVar5;
  Variable *pVVar6;
  Texture2D *pTVar7;
  TextureCube *pTVar8;
  pointer indices;
  bool bVar9;
  int iVar10;
  int width;
  int iVar11;
  int iVar12;
  GLenum GVar13;
  GLuint index;
  GLint location;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TestError *this_00;
  Scalar *pSVar14;
  uint *puVar15;
  char *description;
  int height;
  ChannelOrder CVar16;
  pointer pVVar17;
  pointer pVVar18;
  ConstValueAccess value;
  ConstValueAccess value_00;
  ConstValueAccess value_01;
  TextureLevel rendered;
  vector<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
  texCubeBindings;
  vector<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
  tex2DBindings;
  ConstPixelBufferAccess local_398;
  Random rnd;
  TextureLevel reference;
  ProgramExecutor executor;
  TextureLevel readBuf;
  ConstPixelBufferAccess local_128;
  ShaderProgram program;
  
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  pRVar3 = this->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&executor,(this->m_vertexShader).m_source._M_dataplus._M_p,
             (allocator<char> *)&reference);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rendered,(this->m_fragmentShader).m_source._M_dataplus._M_p,
             (allocator<char> *)&local_398);
  glu::makeVtxFragSources((ProgramSources *)&readBuf,(string *)&executor,(string *)&rendered);
  glu::ShaderProgram::ShaderProgram(&program,pRVar3,(ProgramSources *)&readBuf);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&readBuf);
  std::__cxx11::string::~string((string *)&rendered);
  std::__cxx11::string::~string((string *)&executor);
  glu::operator<<((TestLog *)log,&program);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Failed to compile shader");
  }
  else {
    deRandom_init(&rnd.m_rnd,(this->m_parameters).seed);
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    width = *(int *)CONCAT44(extraout_var,iVar10);
    if (0x3f < *(int *)CONCAT44(extraout_var,iVar10)) {
      width = 0x40;
    }
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = *(int *)(CONCAT44(extraout_var_00,iVar10) + 4);
    height = 0x40;
    if (iVar10 < 0x40) {
      height = iVar10;
    }
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar10 = de::Random::getInt(&rnd,0,*(int *)CONCAT44(extraout_var_01,iVar10) - width);
    iVar11 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar11 = de::Random::getInt(&rnd,0,*(int *)(CONCAT44(extraout_var_02,iVar11) + 4) - height);
    iVar12 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    CVar16 = (0 < *(int *)(CONCAT44(extraout_var_03,iVar12) + 0x14)) + RGB;
    readBuf.m_format.type = UNORM_INT8;
    readBuf.m_format.order = CVar16;
    tcu::TextureLevel::TextureLevel(&rendered,&readBuf.m_format,width,height,1);
    readBuf.m_format.type = UNORM_INT8;
    tcu::TextureLevel::TextureLevel(&reference,&readBuf.m_format,width,height,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&readBuf,&reference);
    rsg::ProgramExecutor::ProgramExecutor
              (&executor,(PixelBufferAccess *)&readBuf,this->m_gridWidth,this->m_gridHeight);
    glwUseProgram(program.m_program.m_program);
    GVar13 = glwGetError();
    pSVar14 = (Scalar *)0x1e6;
    glu::checkError(GVar13,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x1e6);
    pIVar1 = &readBuf.m_size;
    for (pVVar18 = (this->m_vertexArrays).
                   super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pVVar18 !=
        (this->m_vertexArrays).
        super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>._M_impl.
        super__Vector_impl_data._M_finish; pVVar18 = pVVar18 + 1) {
      index = glwGetAttribLocation
                        (program.m_program.m_program,
                         (pVVar18->m_input->m_variable->m_name)._M_dataplus._M_p);
      readBuf.m_format = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
      std::operator<<((ostream *)pIVar1,"attribute[");
      std::ostream::operator<<(pIVar1,index);
      std::operator<<((ostream *)pIVar1,"]: ");
      std::operator<<((ostream *)pIVar1,(pVVar18->m_input->m_variable->m_name)._M_dataplus._M_p);
      std::operator<<((ostream *)pIVar1," = ");
      pSVar4 = pVVar18->m_input;
      message = (MessageBuilder *)pSVar4->m_variable;
      pSVar5 = (pSVar4->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
               .super__Vector_impl_data._M_start;
      value.m_value = pSVar14;
      value.m_type = (VariableType *)
                     (pSVar4->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      anon_unknown_5::operator<<((anon_unknown_5 *)&readBuf,message,value);
      std::operator<<((ostream *)pIVar1," -> ");
      value_00.m_value = pSVar14;
      value_00.m_type = (VariableType *)pSVar5;
      anon_unknown_5::operator<<((anon_unknown_5 *)&readBuf,message,value_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&readBuf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
      if (-1 < (int)index) {
        pSVar14 = (Scalar *)0x0;
        glwVertexAttribPointer
                  (index,(pVVar18->m_input->m_variable->m_type).m_numElements,0x1406,'\0',0,
                   (pVVar18->m_vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
        glwEnableVertexAttribArray(index);
      }
    }
    GVar13 = glwGetError();
    puVar15 = (uint *)0x1f6;
    glu::checkError(GVar13,"After attribute setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x1f6);
    pIVar1 = &readBuf.m_size;
    for (pVVar17 = (this->m_uniforms).
                   super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pVVar17 !=
        (this->m_uniforms).
        super__Vector_base<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>._M_impl.
        super__Vector_impl_data._M_finish; pVVar17 = pVVar17 + 1) {
      location = glwGetUniformLocation
                           (program.m_program.m_program,
                            (pVVar17->m_variable->m_name)._M_dataplus._M_p);
      readBuf.m_format = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
      std::operator<<((ostream *)pIVar1,"uniform[");
      std::ostream::operator<<(pIVar1,location);
      std::operator<<((ostream *)pIVar1,"]: ");
      std::operator<<((ostream *)pIVar1,(pVVar17->m_variable->m_name)._M_dataplus._M_p);
      std::operator<<((ostream *)pIVar1," = ");
      value_01.m_value = (Scalar *)puVar15;
      value_01.m_type =
           (VariableType *)
           (pVVar17->m_storage).m_value.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
      anon_unknown_5::operator<<
                ((anon_unknown_5 *)&readBuf,(MessageBuilder *)pVVar17->m_variable,value_01);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&readBuf,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar1);
      if (-1 < location) {
        pVVar6 = pVVar17->m_variable;
        TVar2 = (pVVar6->m_type).m_baseType;
        puVar15 = (uint *)(ulong)TVar2;
        if (TYPE_SAMPLER_CUBE < TVar2) {
LAB_014c238c:
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unsupported type",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                     ,0x194);
LAB_014c23e0:
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        pSVar5 = (pVVar17->m_storage).m_value.
                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((0xccU >> (TVar2 & 0x1f) & 1) == 0) {
          if (TVar2 != TYPE_FLOAT) goto LAB_014c238c;
          puVar15 = &switchD_014c1f40::switchdataD_018fbd70;
          switch((pVVar6->m_type).m_numElements) {
          case 1:
            glwUniform1fv(location,1,&pSVar5->floatVal);
            break;
          case 2:
            glwUniform2fv(location,1,&pSVar5->floatVal);
            break;
          case 3:
            glwUniform3fv(location,1,&pSVar5->floatVal);
            break;
          case 4:
            glwUniform4fv(location,1,&pSVar5->floatVal);
            break;
          default:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unsupported type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                       ,0x181);
            goto LAB_014c23e0;
          }
        }
        else {
          switch((pVVar6->m_type).m_numElements) {
          case 1:
            glwUniform1iv(location,1,&pSVar5->intVal);
            break;
          case 2:
            glwUniform2iv(location,1,&pSVar5->intVal);
            break;
          case 3:
            glwUniform3iv(location,1,&pSVar5->intVal);
            break;
          case 4:
            glwUniform4iv(location,1,&pSVar5->intVal);
            break;
          default:
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Unsupported type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                       ,399);
            goto LAB_014c23e0;
          }
        }
      }
    }
    GVar13 = glwGetError();
    glu::checkError(GVar13,"After uniform setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x202);
    TextureManager::getBindings2D(&tex2DBindings,&this->m_texManager);
    TextureManager::getBindingsCube(&texCubeBindings,&this->m_texManager);
    for (; tex2DBindings.
           super__Vector_base<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           tex2DBindings.
           super__Vector_base<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        tex2DBindings.
        super__Vector_base<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             tex2DBindings.
             super__Vector_base<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      iVar12 = (tex2DBindings.
                super__Vector_base<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first;
      pTVar7 = (tex2DBindings.
                super__Vector_base<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second;
      glwActiveTexture(iVar12 + 0x84c0);
      glwBindTexture(0xde1,pTVar7->m_glTexture);
      glu::mapGLSampler((Sampler *)&readBuf,0x812f,0x812f,0x2601,0x2601);
      rsg::ProgramExecutor::setTexture(&executor,iVar12,&pTVar7->m_refTexture,(Sampler *)&readBuf);
    }
    GVar13 = glwGetError();
    glu::checkError(GVar13,"After 2D texture setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x212);
    for (; texCubeBindings.
           super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           texCubeBindings.
           super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
        texCubeBindings.
        super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             texCubeBindings.
             super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) {
      iVar12 = (texCubeBindings.
                super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->first;
      pTVar8 = (texCubeBindings.
                super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second;
      glwActiveTexture(iVar12 + 0x84c0);
      glwBindTexture(0x8513,pTVar8->m_glTexture);
      glu::mapGLSampler((Sampler *)&readBuf,0x812f,0x812f,0x2601,0x2601);
      rsg::ProgramExecutor::setTexture(&executor,iVar12,&pTVar8->m_refTexture,(Sampler *)&readBuf);
    }
    GVar13 = glwGetError();
    glu::checkError(GVar13,"After cubemap setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x21e);
    glwViewport(iVar10,iVar11,width,height);
    indices = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    glwDrawElements(4,(GLsizei)((ulong)((long)(this->m_indices).
                                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)indices) >> 1),0x1403,indices);
    glwFlush();
    GVar13 = glwGetError();
    glu::checkError(GVar13,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                    ,0x224);
    rsg::ProgramExecutor::execute
              (&executor,&this->m_vertexShader,&this->m_fragmentShader,&this->m_uniforms);
    if (rendered.m_format == (TextureFormat)0x300000008) {
      pRVar3 = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&readBuf,&rendered);
      glu::readPixels(pRVar3,iVar10,iVar11,(PixelBufferAccess *)&readBuf);
    }
    else {
      local_398.m_format.order = RGBA;
      local_398.m_format.type = UNORM_INT8;
      tcu::TextureLevel::TextureLevel
                (&readBuf,&local_398.m_format,rendered.m_size.m_data[0],rendered.m_size.m_data[1],1)
      ;
      pRVar3 = this->m_renderCtx;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_398,&readBuf);
      glu::readPixels(pRVar3,iVar10,iVar11,(PixelBufferAccess *)&local_398);
      GVar13 = glwGetError();
      glu::checkError(GVar13,"Read pixels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsRandomShaderCase.cpp"
                      ,0x22e);
      tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_398,&rendered);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_128,&readBuf);
      tcu::copy((EVP_PKEY_CTX *)&local_398,(EVP_PKEY_CTX *)&local_128);
      tcu::TextureLevel::~TextureLevel(&readBuf);
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&readBuf,&reference);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_398,&rendered);
    bVar9 = tcu::fuzzyCompare((TestLog *)log,"Result","Result images",
                              (ConstPixelBufferAccess *)&readBuf,&local_398,0.02,COMPARE_LOG_RESULT)
    ;
    description = "Image comparison failed";
    if (bVar9) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar9,description);
    std::
    _Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
    ::~_Vector_base(&texCubeBindings.
                     super__Vector_base<std::pair<int,_const_glu::TextureCube_*>,_std::allocator<std::pair<int,_const_glu::TextureCube_*>_>_>
                   );
    std::
    _Vector_base<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
    ::~_Vector_base(&tex2DBindings.
                     super__Vector_base<std::pair<int,_const_glu::Texture2D_*>,_std::allocator<std::pair<int,_const_glu::Texture2D_*>_>_>
                   );
    rsg::ProgramExecutor::~ProgramExecutor(&executor);
    tcu::TextureLevel::~TextureLevel(&reference);
    tcu::TextureLevel::~TextureLevel(&rendered);
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

RandomShaderCase::IterateResult RandomShaderCase::iterate (void)
{
	tcu::TestLog& log = m_testCtx.getLog();

	// Compile program
	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(m_vertexShader.getSource(), m_fragmentShader.getSource()));
	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
		return STOP;
	}

	// Compute random viewport
	de::Random				rnd				(m_parameters.seed);
	int						viewportWidth	= de::min<int>(VIEWPORT_WIDTH,	m_renderCtx.getRenderTarget().getWidth());
	int						viewportHeight	= de::min<int>(VIEWPORT_HEIGHT,	m_renderCtx.getRenderTarget().getHeight());
	int						viewportX		= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth()	- viewportWidth);
	int						viewportY		= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportHeight);
	bool					hasAlpha		= m_renderCtx.getRenderTarget().getPixelFormat().alphaBits > 0;
	tcu::TextureLevel		rendered		(tcu::TextureFormat(hasAlpha ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), viewportWidth, viewportHeight);
	tcu::TextureLevel		reference		(tcu::TextureFormat(hasAlpha ? tcu::TextureFormat::RGBA : tcu::TextureFormat::RGB, tcu::TextureFormat::UNORM_INT8), viewportWidth, viewportHeight);

	// Reference program executor.
	rsg::ProgramExecutor	executor		(reference.getAccess(), m_gridWidth, m_gridHeight);

	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	// Set up attributes
	for (vector<VertexArray>::const_iterator attribIter = m_vertexArrays.begin(); attribIter != m_vertexArrays.end(); attribIter++)
	{
		GLint location = glGetAttribLocation(program.getProgram(), attribIter->getName());

		// Print to log.
		log << tcu::TestLog::Message << "attribute[" << location << "]: " << attribIter->getName() << " = " << attribIter->getValueRange() << tcu::TestLog::EndMessage;

		if (location >= 0)
		{
			glVertexAttribPointer(location, attribIter->getNumComponents(), GL_FLOAT, GL_FALSE, 0, &attribIter->getVertices()[0]);
			glEnableVertexAttribArray(location);
		}
	}
	GLU_CHECK_MSG("After attribute setup");

	// Uniforms
	for (vector<rsg::VariableValue>::const_iterator uniformIter = m_uniforms.begin(); uniformIter != m_uniforms.end(); uniformIter++)
	{
		GLint location = glGetUniformLocation(program.getProgram(), uniformIter->getVariable()->getName());

		log << tcu::TestLog::Message << "uniform[" << location << "]: " << uniformIter->getVariable()->getName() << " = " << uniformIter->getValue() << tcu::TestLog::EndMessage;

		if (location >= 0)
			setUniformValue(location, uniformIter->getValue());
	}
	GLU_CHECK_MSG("After uniform setup");

	// Textures
	vector<pair<int, const glu::Texture2D*> >	tex2DBindings		= m_texManager.getBindings2D();
	vector<pair<int, const glu::TextureCube*> >	texCubeBindings		= m_texManager.getBindingsCube();

	for (vector<pair<int, const glu::Texture2D*> >::const_iterator i = tex2DBindings.begin(); i != tex2DBindings.end(); i++)
	{
		int						unitNdx		= i->first;
		const glu::Texture2D*	texture		= i->second;

		glActiveTexture(GL_TEXTURE0 + unitNdx);
		glBindTexture(GL_TEXTURE_2D, texture->getGLTexture());

		executor.setTexture(unitNdx, &texture->getRefTexture(), glu::mapGLSampler(TEXTURE_WRAP_S, TEXTURE_WRAP_T, TEXTURE_MIN_FILTER, TEXTURE_MAG_FILTER));
	}
	GLU_CHECK_MSG("After 2D texture setup");

	for (vector<pair<int, const glu::TextureCube*> >::const_iterator i = texCubeBindings.begin(); i != texCubeBindings.end(); i++)
	{
		int						unitNdx		= i->first;
		const glu::TextureCube*	texture		= i->second;

		glActiveTexture(GL_TEXTURE0 + unitNdx);
		glBindTexture(GL_TEXTURE_CUBE_MAP, texture->getGLTexture());

		executor.setTexture(unitNdx, &texture->getRefTexture(), glu::mapGLSampler(TEXTURE_WRAP_S, TEXTURE_WRAP_T, TEXTURE_MIN_FILTER, TEXTURE_MAG_FILTER));
	}
	GLU_CHECK_MSG("After cubemap setup");

	// Draw and read
	glViewport(viewportX, viewportY, viewportWidth, viewportHeight);
	glDrawElements(GL_TRIANGLES, (GLsizei)m_indices.size(), GL_UNSIGNED_SHORT, &m_indices[0]);
	glFlush();
	GLU_CHECK_MSG("Draw");

	// Render reference while GPU is doing work
	executor.execute(m_vertexShader, m_fragmentShader, m_uniforms);

	if (rendered.getFormat().order != tcu::TextureFormat::RGBA || rendered.getFormat().type != tcu::TextureFormat::UNORM_INT8)
	{
		// Read as GL_RGBA8
		tcu::TextureLevel readBuf(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), rendered.getWidth(), rendered.getHeight());
		glu::readPixels(m_renderCtx, viewportX, viewportY, readBuf.getAccess());
		GLU_CHECK_MSG("Read pixels");
		tcu::copy(rendered, readBuf);
	}
	else
		glu::readPixels(m_renderCtx, viewportX, viewportY, rendered.getAccess());

	// Compare
	{
		float	threshold	= 0.02f;
		bool	imagesOk	= tcu::fuzzyCompare(log, "Result", "Result images", reference.getAccess(), rendered.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);

		if (imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}